

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

table_type * __thiscall
toml::basic_value<toml::type_config>::as_table_abi_cxx11_(basic_value<toml::type_config> *this)

{
  allocator<char> local_31;
  string local_30;
  
  if (this->type_ == table) {
    return (table_type *)(this->field_1).integer_.value;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"toml::value::as_table()",&local_31);
  throw_bad_cast(this,&local_30,table);
}

Assistant:

table_type& as_table()
    {
        if(this->type_ != value_t::table)
        {
            this->throw_bad_cast("toml::value::as_table()", value_t::table);
        }
        return this->table_.value.get();
    }